

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O0

void ihevc_intra_pred_chroma_mode_11_to_17
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int in_ECX;
  int iVar7;
  long in_RDX;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  WORD32 fract_v;
  WORD32 fract_u;
  WORD32 pos_v;
  WORD32 pos_u;
  WORD32 ref_idx;
  WORD32 ref_main_idx_v;
  WORD32 ref_main_idx_u;
  WORD32 idx_v;
  WORD32 idx_u;
  WORD32 inv_ang_sum;
  WORD32 inv_ang;
  WORD32 intra_pred_ang;
  WORD32 k;
  WORD32 col;
  WORD32 row;
  byte local_e8 [112];
  UWORD8 *ref_main;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_20;
  int local_1c;
  long local_18;
  long local_8;
  
  local_3c = 0x80;
  local_34 = gai4_ihevc_ang_table[in_R9D];
  local_38 = gai4_ihevc_inv_ang_table[in_R9D + -0xb];
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_30 = 0; SBORROW4(local_30,(local_20 + 1) * 2) != local_30 + (local_20 + 1) * -2 < 0;
      local_30 = local_30 + 2) {
    local_e8[local_30 + (local_20 + -1) * 2] = *(byte *)(local_8 + (local_20 * 4 - local_30));
    local_e8[local_30 + 1 + (local_20 + -1) * 2] =
         *(byte *)(local_8 + ((local_20 * 4 - local_30) + 1));
  }
  lVar1 = (long)((local_20 + -1) * 2) + -0xe8;
  iVar2 = local_20 * local_34 >> 5;
  for (local_30 = -2; iVar7 = iVar2 * 2,
      local_30 != iVar7 && SBORROW4(local_30,iVar7) == local_30 + iVar2 * -2 < 0;
      local_30 = local_30 + -2) {
    local_3c = local_38 + local_3c;
    local_e8[local_30 + lVar1 + 0xe8] = *(byte *)(local_8 + (local_20 * 4 + (local_3c >> 8) * 2));
    local_e8[(local_30 + 1) + lVar1 + 0xe8] =
         *(byte *)(local_8 + (local_20 * 4 + 1 + (local_3c >> 8) * 2));
  }
  for (local_2c = 0; SBORROW4(local_2c,local_20 * 2) != local_2c + local_20 * -2 < 0;
      local_2c = local_2c + 2) {
    uVar3 = (local_2c / 2 + 1) * local_34;
    uVar4 = (local_2c / 2 + 1) * local_34;
    uVar5 = uVar3 & 0x1f;
    uVar6 = uVar4 & 0x1f;
    for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
      iVar2 = (local_28 + ((int)uVar3 >> 5) + 1) * 2;
      iVar7 = (local_28 + ((int)uVar4 >> 5) + 1) * 2;
      *(char *)(local_18 + (local_2c + local_1c * local_28)) =
           (char)((int)((0x20 - uVar5) * (uint)local_e8[iVar2 + lVar1 + 0xe8] +
                        uVar5 * local_e8[(iVar2 + 2) + lVar1 + 0xe8] + 0x10) >> 5);
      *(char *)(local_18 + (local_2c + 1 + local_1c * local_28)) =
           (char)((int)((0x20 - uVar6) * (uint)local_e8[(iVar7 + 1) + lVar1 + 0xe8] +
                        uVar6 * local_e8[(iVar7 + 3) + lVar1 + 0xe8] + 0x10) >> 5);
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode_11_to_17(UWORD8 *pu1_ref,
                                           WORD32 src_strd,
                                           UWORD8 *pu1_dst,
                                           WORD32 dst_strd,
                                           WORD32 nt,
                                           WORD32 mode)
{
    /* This function and ihevc_intra_pred_CHROMA_mode_19_to_25 are same except*/
    /* for ref main & side samples assignment,can be combined for */
    /* optimzation*/

    WORD32 row, col, k;
    WORD32 intra_pred_ang, inv_ang, inv_ang_sum;
    WORD32 idx_u, idx_v, ref_main_idx_u, ref_main_idx_v, ref_idx;
    WORD32 pos_u, pos_v, fract_u, fract_v;

    UWORD8 ref_temp[2 * MAX_CU_SIZE + 2];
    UWORD8 *ref_main;
    UNUSED(src_strd);
    inv_ang_sum = 128;

    intra_pred_ang = gai4_ihevc_ang_table[mode];

    inv_ang = gai4_ihevc_inv_ang_table[mode - 11];
    /* Intermediate reference samples for negative angle modes */
    /* This have to be removed during optimization*/

    /* For horizontal modes, (ref main = ref left) (ref side = ref above) */


    ref_main = ref_temp + 2 * nt;
    for(k = 0; k < (2 * (nt + 1)); k += 2)
    {
        ref_temp[k + (2 * (nt - 1))] = pu1_ref[(4 * nt) - k];
        ref_temp[k + 1 + (2 * (nt - 1))] = pu1_ref[(4 * nt) - k + 1];
    }

    ref_main = ref_temp + (2 * (nt - 1));
    ref_idx = (nt * intra_pred_ang) >> 5;

    /* SIMD Optimization can be done using look-up table for the loop */
    /* For negative angled derive the main reference samples from side */
    /*  reference samples refer to section 8.4.4.2.6 */
    for(k = -2; k > (2 * ref_idx); k -= 2)
    {
        inv_ang_sum += inv_ang;
        ref_main[k] = pu1_ref[(4 * nt) + ((inv_ang_sum >> 8) << 1)];
        ref_main[k + 1] = pu1_ref[((4 * nt) + 1) + ((inv_ang_sum >> 8) << 1)];
    }

    /* For the angles other then 45 degree, interpolation btw 2 neighboring */
    /* samples dependent on distance to obtain destination sample */
    for(col = 0; col < (2 * nt); col += 2)
    {
        pos_u = ((col / 2 + 1) * intra_pred_ang);
        pos_v = ((col / 2 + 1) * intra_pred_ang);
        idx_u = pos_u >> 5;
        idx_v = pos_v >> 5;
        fract_u = pos_u & (31);
        fract_v = pos_v & (31);

        // Do linear filtering
        for(row = 0; row < nt; row++)
        {
            ref_main_idx_u = 2 * (row + idx_u + 1);
            ref_main_idx_v = 2 * (row + idx_v + 1) + 1;

            pu1_dst[col + (dst_strd * row)] = (UWORD8)(((32 - fract_u)
                            * ref_main[ref_main_idx_u]
                            + fract_u * ref_main[ref_main_idx_u + 2] + 16) >> 5);
            pu1_dst[(col + 1) + (dst_strd * row)] = (UWORD8)(((32 - fract_v)
                            * ref_main[ref_main_idx_v]
                            + fract_v * ref_main[ref_main_idx_v + 2] + 16) >> 5);

        }

    }

}